

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_mips.cpp
# Opt level: O0

void __thiscall
AdvancedMipsGenerator::Transform2REG(AdvancedMipsGenerator *this,string *in,string *out)

{
  string *__lhs;
  bool bVar1;
  __type _Var2;
  allocator local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *out_local;
  string *in_local;
  AdvancedMipsGenerator *this_local;
  
  local_20 = out;
  out_local = in;
  in_local = (string *)this;
  bVar1 = REGJudge(this,in);
  __lhs = out_local;
  if (bVar1) {
    std::__cxx11::string::operator=((string *)local_20,(string *)out_local);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"$v0",&local_41);
    _Var2 = std::operator==(__lhs,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    if (_Var2) {
      std::__cxx11::string::operator=((string *)local_20,"$v0");
    }
  }
  return;
}

Assistant:

void AdvancedMipsGenerator::Transform2REG(const string& in, string& out) {
    if (REGJudge(in)) {
        out = in;
    } else if (in == V0_REG) {
        out = "$v0";
    }
}